

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

Reg asm_setup_call_slots(ASMState *as,IRIns *ir,CCallInfo *ci)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  IRRef args [64];
  IRRef local_118 [64];
  
  asm_collectargs(as,ir,(CCallInfo *)(ulong)ci->flags,local_118);
  uVar1 = (ulong)(byte)ci->flags;
  if (uVar1 == 0) {
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    iVar4 = 6;
    iVar5 = 8;
    iVar2 = 0;
    do {
      if (((ulong)local_118[uVar3] == 0) ||
         (1 < (byte)((*(byte *)((long)as->ir + (ulong)local_118[uVar3] * 8 + 4) & 0x1f) - 0xd))) {
        if (iVar4 < 1) goto LAB_0013e172;
        iVar4 = iVar4 + -1;
      }
      else if (iVar5 < 1) {
LAB_0013e172:
        iVar2 = iVar2 + 2;
      }
      else {
        iVar5 = iVar5 + -1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (as->evenspill < iVar2) {
    as->evenspill = iVar2;
  }
  return ((byte)(((ir->field_1).t.irt & 0x1f) - 0xd) < 2 | 8) << 4;
}

Assistant:

static Reg asm_setup_call_slots(ASMState *as, IRIns *ir, const CCallInfo *ci)
{
  IRRef args[CCI_NARGS_MAX*2];
  int nslots;
  asm_collectargs(as, ir, ci, args);
  nslots = asm_count_call_slots(as, ci, args);
  if (nslots > as->evenspill)  /* Leave room for args in stack slots. */
    as->evenspill = nslots;
#if LJ_64
  return irt_isfp(ir->t) ? REGSP_HINT(RID_FPRET) : REGSP_HINT(RID_RET);
#else
  return irt_isfp(ir->t) ? REGSP_INIT : REGSP_HINT(RID_RET);
#endif
}